

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace14.h
# Opt level: O3

Worker * lace_steal(WorkerP *self,Task *__dq_head,Worker *victim)

{
  Task *pTVar1;
  Worker *in_RAX;
  Worker *pWVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((victim != (Worker *)0x0) && (victim->allstolen == '\0')) {
    pWVar2 = (Worker *)(victim->ts).v;
    in_RAX = (Worker *)((ulong)pWVar2 >> 0x20);
    if ((uint)pWVar2 < (uint)((ulong)pWVar2 >> 0x20)) {
      LOCK();
      in_RAX = (Worker *)(victim->ts).v;
      bVar4 = pWVar2 == in_RAX;
      if (bVar4) {
        (victim->ts).v = (ulong)((uint)pWVar2 + 1) | (ulong)pWVar2 & 0xffffffff00000000;
        in_RAX = pWVar2;
      }
      UNLOCK();
      if (bVar4) {
        pTVar1 = victim->dq;
        uVar3 = (ulong)pWVar2 & 0xffffffff;
        pTVar1[uVar3].thief = self->_public;
        pWVar2 = (Worker *)(*pTVar1[uVar3].f)(self,__dq_head,pTVar1 + uVar3);
        pTVar1[uVar3].thief = (_Worker *)0x2;
        return pWVar2;
      }
    }
    else if (victim->movesplit == '\0') {
      victim->movesplit = '\x01';
      return in_RAX;
    }
  }
  return in_RAX;
}

Assistant:

lace_steal(WorkerP *self, Task *__dq_head, Worker *victim)
{
    if (victim != NULL && !victim->allstolen) {
        TailSplitNA ts;
        ts.v = victim->ts.v;
        if (ts.ts.tail < ts.ts.split) {
            TailSplitNA ts_new;
            ts_new.v = ts.v;
            ts_new.ts.tail++;
            if (atomic_compare_exchange_weak(&victim->ts.v, &ts.v, ts_new.v)) {
                // Stolen
                Task *t = &victim->dq[ts.ts.tail];
                atomic_store_explicit(&t->thief, self->_public, memory_order_relaxed);
                lace_time_event(self, 1);
                t->f(self, __dq_head, t);
                lace_time_event(self, 2);
                atomic_store_explicit(&t->thief, THIEF_COMPLETED, memory_order_release);
                lace_time_event(self, 8);
                return LACE_STOLEN;
            }

            lace_time_event(self, 7);
            return LACE_BUSY;
        }

        if (victim->movesplit == 0) {
            victim->movesplit = 1;
            PR_COUNTSPLITS(self, CTR_split_req);
        }
    }

    lace_time_event(self, 7);
    return LACE_NOWORK;
}